

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * makeTempDir_abi_cxx11_(void)

{
  char *pcVar1;
  ostream *poVar2;
  int *piVar3;
  string *in_RDI;
  char local_1018 [4104];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  memset(local_1018 + 0x17,0,0xfe9);
  builtin_strncpy(local_1018,"/var/tmp/OpenEXR_XXXXXX",0x17);
  pcVar1 = mkdtemp(local_1018);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign((char *)in_RDI);
    std::__cxx11::string::append((char *)in_RDI);
    poVar2 = std::operator<<((ostream *)&std::cout,"tempDir = \'");
    poVar2 = std::operator<<(poVar2,(string *)in_RDI);
    poVar2 = std::operator<<(poVar2,"\': ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    return in_RDI;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: mkdtemp( \"");
  poVar2 = std::operator<<(poVar2,local_1018);
  poVar2 = std::operator<<(poVar2,"\" failed: ");
  piVar3 = __errno_location();
  pcVar1 = strerror(*piVar3);
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

std::string
makeTempDir ()
{
    std::string tempDir;
    for (int trycount = 0; trycount < 3; ++trycount)
    {
#ifdef _WIN32
        IMATH_NAMESPACE::Rand48 rand48 (time ((time_t*) 0));
        char                    tmpbuf[4096];
        DWORD                   len = GetTempPathA (4096, tmpbuf);
        if (len == 0 || len > 4095)
        {
            std::cerr << "Cannot retrieve temporary directory" << std::endl;
            exit (1);
        }
        tempDir = tmpbuf;
        // windows does this automatically
        // tempDir += IMF_PATH_SEPARATOR;
        tempDir += "OpenEXRTest_";

        for (int i = 0; i < 8; ++i)
            tempDir += ('A' + rand48.nexti () % 26);

        int status = _mkdir (tempDir.c_str ());

        if (status != 0)
        {
            std::cerr << "ERROR -- mkdir(" << tempDir
                      << ") failed: "
                         "errno = "
                      << errno << std::endl;
            if (errno == EEXIST) continue;
            if (trycount == 2) exit (1);
        }
#else
        char tmpbuf[4096];

        memset (tmpbuf, 0, 4096);
        const char* tmpdirname = IMF_TMP_DIR "OpenEXR_XXXXXX";
        size_t      tlen       = strlen (tmpdirname);
        memcpy (tmpbuf, tmpdirname, tlen);

        char* tmpd = mkdtemp (tmpbuf);
        if (tmpd) { tempDir = tmpd; }
        else
        {
            std::cerr << "ERROR: mkdtemp( \"" << tmpbuf
                      << "\" failed: " << strerror (errno) << std::endl;
            exit (1);
        }
        int status = 0;
#endif
        if (status == 0)
        {
            tempDir += IMF_PATH_SEPARATOR;

            std::cout << "tempDir = '" << tempDir << "': " << tempDir.size ()
                      << std::endl;
            break; // success
        }
    }

    return tempDir;
}